

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.hpp
# Opt level: O3

ostream * test_detail::print_range<std::deque<int,std::allocator<int>>,burst::identity_fn>
                    (ostream *stream,long range)

{
  anon_class_16_2_aa65ec36 __f;
  identity_fn local_59;
  _Deque_iterator<int,_const_int_&,_const_int_*> local_58;
  _Deque_iterator<int,_const_int_&,_const_int_*> local_30;
  
  std::__ostream_insert<char,std::char_traits<char>>(stream,"[",1);
  if (*(int **)(range + 0x10) != *(int **)(range + 0x30)) {
    std::ostream::operator<<(stream,**(int **)(range + 0x10));
    local_30._M_last = *(_Elt_pointer *)(range + 0x20);
    local_30._M_node = *(_Map_pointer *)(range + 0x28);
    local_30._M_cur = (_Elt_pointer)(*(long *)(range + 0x10) + 4);
    if (local_30._M_cur == local_30._M_last) {
      local_30._M_first = local_30._M_node[1];
      local_30._M_node = local_30._M_node + 1;
      local_30._M_last = local_30._M_first + 0x80;
      local_30._M_cur = local_30._M_first;
    }
    else {
      local_30._M_first = *(_Elt_pointer *)(range + 0x18);
    }
    local_58._M_cur = *(_Elt_pointer *)(range + 0x30);
    local_58._M_first = *(_Elt_pointer *)(range + 0x38);
    local_58._M_last = *(_Elt_pointer *)(range + 0x40);
    local_58._M_node = *(_Map_pointer *)(range + 0x48);
    __f.proj = &local_59;
    __f.stream = stream;
    std::
    for_each<std::_Deque_iterator<int,int_const&,int_const*>,test_detail::print_range<std::deque<int,std::allocator<int>>,burst::identity_fn>(std::ostream&,std::deque<int,std::allocator<int>>const&,burst::identity_fn)::_lambda(auto:1_const&)_1_>
              (&local_30,&local_58,__f);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"]",1);
  return stream;
}

Assistant:

std::ostream & print_range (std::ostream & stream, const Range & range, UnaryFunction proj)
    {
        stream << "[";

        using std::begin;
        using std::end;

        if (begin(range) != end(range))
        {
            stream << proj(*begin(range));
            std::for_each(std::next(begin(range)), end(range),
                [& stream, & proj] (const auto & value)
                {
                    stream << ", " << proj(value);
                });
        }

        return stream << "]";
    }